

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_soundfile.c
# Opt level: O3

int64_t swap8s(int64_t n,int doit)

{
  ulong uVar1;
  
  uVar1 = (ulong)n >> 0x38 | (n & 0xff000000000000U) >> 0x28 | (n & 0xff0000000000U) >> 0x18 |
          (n & 0xff00000000U) >> 8 | (n & 0xff000000U) << 8 | (n & 0xff0000U) << 0x18 |
          (n & 0xff00U) << 0x28 | n << 0x38;
  if (doit == 0) {
    uVar1 = n;
  }
  return uVar1;
}

Assistant:

int64_t swap8s(int64_t n, int doit)
{
    if (doit)
    {
        n = ((n <<  8) & 0xff00ff00ff00ff00ULL) |
            ((n >>  8) & 0x00ff00ff00ff00ffULL);
        n = ((n << 16) & 0xffff0000ffff0000ULL) |
            ((n >> 16) & 0x0000ffff0000ffffULL );
        return (n << 32) | ((n >> 32) & 0xffffffffULL);
    }
    return n;
}